

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O2

dtl_dv_t * dtl_json_load(FILE *fh)

{
  int iVar1;
  dtl_dv_t *dv;
  dtl_json_reader_t reader;
  ifstream_t ifstream;
  dtl_json_reader_t dStack_b8;
  ifstream_t local_50;
  ifstream_handler_t local_30;
  
  dtl_json_reader_create(&dStack_b8);
  local_30.open = (_func_void_void_ptr *)0x0;
  local_30.write = dtl_json_reader_readChunk;
  local_30.close = dtl_json_reader_close;
  local_30.arg = &dStack_b8;
  ifstream_create(&local_50,&local_30);
  iVar1 = ifstream_readTextFileFromHandle(&local_50,fh);
  if (((iVar1 == 0) && (dStack_b8.parseComplete == true)) &&
     (dv = (dStack_b8.data)->currentElem, dv != (dtl_dv_t *)0x0)) {
    dtl_dv_inc_ref(dv);
  }
  else {
    dv = (dtl_dv_t *)0x0;
  }
  dtl_json_reader_destroy(&dStack_b8);
  return dv;
}

Assistant:

dtl_dv_t* dtl_json_load(FILE *fh)
{
   dtl_dv_t *retval = (dtl_dv_t*) 0;
   ifstream_handler_t handler;
   ifstream_t ifstream;
   dtl_json_reader_t reader;
   dtl_json_reader_create(&reader);
   memset(&handler, 0, sizeof(handler));
   handler.arg = (void*) &reader;
   handler.write = dtl_json_reader_readChunk;
   handler.close = dtl_json_reader_close;
   ifstream_create(&ifstream, &handler);
   if (ifstream_readTextFileFromHandle(&ifstream, fh) == 0)
   {
      if ( (reader.parseComplete) && (reader.data->currentElem != 0) )
      {
         retval = reader.data->currentElem;
         dtl_dv_inc_ref(reader.data->currentElem);
      }
      dtl_json_reader_destroy(&reader);
   }
   else
   {
      dtl_json_reader_destroy(&reader);
   }
   return retval;
}